

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantities_testing_c.h
# Opt level: O1

void Quantities_init_am_matrices_(Quantities *quan,Dimensions dims,Env *env)

{
  Pointer *p;
  P *pPVar1;
  bool bVar2;
  Bool_t BVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  double dVar25;
  long local_98;
  int local_90;
  long local_60;
  long local_58;
  long local_50;
  
  BVar3 = Env_cuda_is_using_device(env);
  Pointer_create(&quan->a_from_m,(long)(dims.nm * dims.na * 8),BVar3);
  p = &quan->m_from_a;
  lVar21 = (long)dims.nm;
  uVar5 = (ulong)(uint)dims.na;
  BVar3 = Env_cuda_is_using_device(env);
  Pointer_create(p,(long)(dims.nm * dims.na * 8),BVar3);
  Pointer_allocate(&quan->a_from_m);
  Pointer_allocate(p);
  uVar12 = 0;
  iVar4 = 0;
  do {
    uVar22 = (ulong)(uint)dims.nm;
    uVar11 = uVar12;
    if (0 < dims.nm) {
      do {
        if (0 < dims.na) {
          if (quan == (Quantities *)0x0) goto LAB_001040a3;
          pPVar1 = (quan->a_from_m).h_;
          if (pPVar1 == (P *)0x0) goto LAB_00104065;
          memset(pPVar1 + uVar11,0,(ulong)(uint)dims.na << 3);
        }
        uVar11 = uVar11 + dims.na;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
    }
    iVar4 = iVar4 + 1;
    uVar12 = uVar12 + dims.na * 0x10;
  } while (iVar4 != 8);
  uVar12 = (dims.nm + -1) * dims.na;
  lVar18 = 0;
  lVar24 = 0;
  do {
    if (0 < dims.na) {
      if (quan == (Quantities *)0x0) {
LAB_001040a3:
        __assert_fail("p",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/pointer_kernels.h"
                      ,0x30,"P *restrict Pointer_h(Pointer *)");
      }
      pPVar1 = (quan->a_from_m).h_;
      if (pPVar1 == (P *)0x0) goto LAB_00104065;
      if (dims.nm < 1) {
LAB_00104046:
        __assert_fail("im >= 0 && im < dims.nm",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0x156,
                      "P *ref_a_from_m(P *const restrict, const Dimensions, const int, const int, const int)"
                     );
      }
      uVar22 = 0;
      do {
        uVar16 = uVar22 + 1;
        pPVar1[uVar12 + uVar22] =
             (double)(int)((uVar16 & 0xffffffff) / (ulong)(uint)dims.nm) + pPVar1[uVar12 + uVar22];
        iVar4 = (int)((uVar16 & 0xffffffff) % (ulong)(uint)dims.nm);
        if (iVar4 != 0) {
          *(double *)((long)pPVar1 + uVar22 * 8 + lVar18) =
               *(double *)((long)pPVar1 + uVar22 * 8 + lVar18) + -1.0;
          uVar19 = (ulong)(uint)((iVar4 + (int)(lVar24 << 4)) * dims.na);
          pPVar1[uVar22 + uVar19] = pPVar1[uVar22 + uVar19] + 1.0;
        }
        uVar22 = uVar16;
      } while ((uint)dims.na != uVar16);
    }
    lVar24 = lVar24 + 1;
    uVar12 = uVar12 + dims.na * 0x10;
    lVar18 = lVar18 + (ulong)(uint)dims.na * 0x80;
  } while (lVar24 != 8);
  local_50 = uVar5 << 4;
  lVar24 = uVar5 * 0x80;
  lVar18 = uVar5 * 8;
  local_58 = 0;
  lVar7 = 0;
  local_60 = lVar18;
  do {
    if (2 < dims.nm) {
      local_90 = 0x15;
      local_98 = local_58;
      uVar22 = 0;
      lVar6 = local_50;
      lVar15 = local_60;
      do {
        if (0 < dims.na) {
          if (quan == (Quantities *)0x0) goto LAB_001040a3;
          pPVar1 = (quan->a_from_m).h_;
          if (pPVar1 == (P *)0x0) goto LAB_00104065;
          if (lVar21 <= (long)uVar22) goto LAB_00104046;
          uVar12 = (uint)uVar22;
          lVar23 = 0;
          iVar4 = local_90;
          do {
            dVar25 = (double)(int)(iVar4 + (uVar12 / 0x11) * -0x11);
            *(double *)((long)pPVar1 + lVar23 * 8 + local_98) =
                 *(double *)((long)pPVar1 + lVar23 * 8 + local_98) - dVar25;
            if (lVar21 <= (long)(uVar22 + 1)) goto LAB_00104046;
            *(double *)((long)pPVar1 + lVar23 * 8 + lVar15) =
                 dVar25 + dVar25 + *(double *)((long)pPVar1 + lVar23 * 8 + lVar15);
            *(double *)((long)pPVar1 + lVar23 * 8 + lVar6) =
                 *(double *)((long)pPVar1 + lVar23 * 8 + lVar6) - dVar25;
            lVar23 = lVar23 + 1;
            iVar4 = iVar4 + dims.nm;
            uVar12 = uVar12 + dims.nm;
          } while (dims.na != lVar23);
        }
        uVar22 = uVar22 + 1;
        lVar6 = lVar6 + lVar18;
        lVar15 = lVar15 + lVar18;
        local_98 = local_98 + lVar18;
        local_90 = local_90 + 1;
      } while (uVar22 != dims.nm - 2);
    }
    lVar7 = lVar7 + 1;
    local_50 = local_50 + lVar24;
    local_60 = local_60 + lVar24;
    local_58 = local_58 + lVar24;
  } while (lVar7 != 8);
  uVar22 = 0;
  lVar18 = 0;
  do {
    iVar4 = (int)uVar22;
    if (0 < dims.nm) {
      iVar13 = 0;
      bVar2 = 0 < dims.nm;
      do {
        iVar14 = (int)uVar22;
        if (0 < dims.na) {
          pPVar1 = (quan->m_from_a).h_;
          if (pPVar1 == (P *)0x0) goto LAB_00104065;
          uVar16 = uVar5;
          if (!bVar2) goto LAB_00104084;
          do {
            pPVar1[uVar22] = 0.0;
            uVar22 = (ulong)((int)uVar22 + 0x10);
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
        }
        iVar13 = iVar13 + 1;
        uVar22 = (ulong)(iVar14 + 1);
        bVar2 = iVar13 < dims.nm;
      } while (iVar13 != dims.nm);
    }
    lVar18 = lVar18 + 1;
    uVar22 = (ulong)(uint)(iVar4 + dims.na * 0x10);
  } while (lVar18 != 8);
  uVar12 = dims.na * 0x10 - 0x10;
  uVar22 = 0;
  lVar18 = 0;
  do {
    if (0 < dims.nm) {
      pPVar1 = (quan->m_from_a).h_;
      if (pPVar1 == (P *)0x0) {
LAB_00104065:
        __assert_fail("p->h_",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/pointer_kernels.h"
                      ,0x31,"P *restrict Pointer_h(Pointer *)");
      }
      if (dims.na < 1) {
        __assert_fail("ia >= 0 && ia < dims.na",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0x197,
                      "P *ref_m_from_a(P *const restrict, const Dimensions, const int, const int, const int)"
                     );
      }
      uVar19 = uVar22 >> 4 & 0xfffffff;
      uVar16 = 0;
      do {
        uVar8 = uVar16 + 1;
        pPVar1[uVar12 + uVar16] =
             (double)(int)((uVar8 & 0xffffffff) / uVar5) + pPVar1[uVar12 + uVar16];
        iVar4 = (int)((uVar8 & 0xffffffff) % uVar5);
        if (iVar4 != 0) {
          pPVar1[uVar19 * 0x10 + uVar16] = pPVar1[uVar19 * 0x10 + uVar16] + -1.0;
          uVar20 = (ulong)(uint)((iVar4 + (int)lVar18 * dims.na) * 0x10);
          pPVar1[uVar16 + uVar20] = pPVar1[uVar16 + uVar20] + 1.0;
        }
        uVar16 = uVar8;
      } while ((uint)dims.nm != uVar8);
    }
    lVar18 = lVar18 + 1;
    uVar22 = uVar22 + uVar5 * 0x10;
    uVar12 = uVar12 + dims.na * 0x10;
    if (lVar18 == 8) {
      uVar22 = 0x20;
      lVar18 = 0;
      do {
        if (0 < dims.nm) {
          iVar4 = 0x25;
          uVar16 = 0;
          uVar19 = 0;
          bVar2 = 0 < dims.nm;
          do {
            iVar13 = (int)uVar16;
            if (2 < dims.na) {
              pPVar1 = (quan->m_from_a).h_;
              if (pPVar1 == (P *)0x0) goto LAB_00104065;
              uVar8 = uVar22;
              uVar20 = (ulong)(dims.na - 2);
              iVar14 = iVar4;
              if (!bVar2) goto LAB_00104084;
              do {
                iVar9 = (int)(uVar16 * 0xaf286bcb >> 0x20);
                dVar25 = (double)(int)(iVar14 + (((uint)((int)uVar16 - iVar9) >> 1) + iVar9 >> 4) *
                                                -0x13);
                uVar10 = (ulong)((int)uVar8 - 0x20);
                pPVar1[uVar19 + uVar10] = pPVar1[uVar19 + uVar10] - dVar25;
                uVar10 = (ulong)((int)uVar8 - 0x10);
                pPVar1[uVar19 + uVar10] = dVar25 + dVar25 + pPVar1[uVar19 + uVar10];
                pPVar1[uVar19 + (uVar8 & 0xffffffff)] =
                     pPVar1[uVar19 + (uVar8 & 0xffffffff)] - dVar25;
                uVar16 = (ulong)(uint)((int)uVar16 + dims.nm);
                uVar20 = uVar20 - 1;
                uVar8 = uVar8 + 0x10;
                iVar14 = iVar14 + dims.nm;
              } while (uVar20 != 0);
            }
            uVar19 = uVar19 + 1;
            bVar2 = (long)uVar19 < lVar21;
            iVar4 = iVar4 + 1;
            uVar16 = (ulong)(iVar13 + 1);
          } while (uVar19 != (uint)dims.nm);
        }
        lVar18 = lVar18 + 1;
        uVar22 = uVar22 + uVar5 * 0x10;
      } while (lVar18 != 8);
      uVar12 = 0;
      lVar21 = 0;
      do {
        if (0 < dims.nm) {
          iVar4 = 0;
          uVar11 = uVar12;
          bVar2 = 0 < dims.nm;
          do {
            if (0 < dims.na) {
              pPVar1 = (quan->m_from_a).h_;
              if (pPVar1 == (P *)0x0) goto LAB_00104065;
              if (!bVar2) {
LAB_00104084:
                __assert_fail("im >= 0 && im < dims.nm",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                              ,0x196,
                              "P *ref_m_from_a(P *const restrict, const Dimensions, const int, const int, const int)"
                             );
              }
              uVar22 = 0;
              uVar17 = uVar11;
              do {
                pPVar1[uVar17] = (pPVar1[uVar17] * 0.125) / (double)(1 << ((byte)uVar22 & 7));
                uVar22 = uVar22 + 1;
                uVar17 = uVar17 + 0x10;
              } while (uVar5 != uVar22);
            }
            iVar4 = iVar4 + 1;
            uVar11 = uVar11 + 1;
            bVar2 = iVar4 < dims.nm;
          } while (iVar4 != dims.nm);
        }
        lVar21 = lVar21 + 1;
        uVar12 = uVar12 + dims.na * 0x10;
        if (lVar21 == 8) {
          Pointer_update_d(&quan->a_from_m);
          Pointer_update_d(p);
          return;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void Quantities_init_am_matrices_( Quantities*       quan,
                                   const Dimensions  dims,
                                   Env*              env )
{
  /*---Declarations---*/

  int im     = 0;
  int ia     = 0;
  int i      = 0;
  int octant = 0;

  /*---Allocate arrays---*/

  Pointer_create( & quan->a_from_m, dims.nm * dims.na * NOCTANT,
                                             Env_cuda_is_using_device( env ) );
  Pointer_create( & quan->m_from_a, dims.nm * dims.na * NOCTANT,
                                             Env_cuda_is_using_device( env ) );

  Pointer_allocate( & quan->a_from_m );
  Pointer_allocate( & quan->m_from_a );

  /*-----------------------------*/
  /*---Set entries of a_from_m---*/
  /*-----------------------------*/

  /*---These two matrices are set in a special way so as to map a vector
       whose values satisfy a linear relationship v_i = a * i + b
       are mapped to another vector with same property.  This is to facilitate
       being able to have an analytical solution for the sweep.
  ---*/

  /*---First set to zero---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm;     ++im )
  for( ia=0;     ia<dims.na;     ++ia )
  {
    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, im, ia, octant )
                                                                   = P_zero();
  }

  /*---Map a linear vector of values to a similar linear vector of values---*/

  /*---The input state vector in the moment dimension is contrived to
       satisfy vi[im] = 1 + im, an affine function, possibly times a constant.
       The following matrix is artifically contrived to send this to
       a result satisfying, in angle, vl[ia] = 1 + ia, possibly times a
       constant.
  ---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( i=0;      i<dims.na;      ++i )
  {
    const int quot = ( i + 1 ) / dims.nm;
    const int rem  = ( i + 1 ) % dims.nm;

    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, dims.nm-1, i, octant )
                                                                       += quot;
    if( rem != 0 )
    {
      *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, 0,   i, octant )
                                                                   += -P_one();
      *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, rem, i, octant )
                                                                   +=  P_one();
    }
  }

  /*---Fill matrix with entries that leave linears unaffected---*/

  /*---This is to create a more dense, nontrivial matrix, with additions
       to the rows that are guaranteed to send affine functions to zero.
  ---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm-2;   ++im )
  for( ia=0;     ia<dims.na;     ++ia )
  {
    const int randvalue = 21 + ( im + dims.nm * ia ) % 17;

    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, im+0, ia, octant ) +=
                                                          -P_one() * randvalue;
    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, im+1, ia, octant ) +=
                                                         2*P_one() * randvalue;
    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, im+2, ia, octant ) +=
                                                          -P_one() * randvalue;
  }

  /*-----------------------------*/
  /*---Set entries of m_from_a---*/
  /*-----------------------------*/

  /*---First set to zero---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm;     ++im )
  for( ia=0;     ia<dims.na;     ++ia )
  {
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia, octant )
                                                                    = P_zero();
  }

  /*---Map a linear vector of values to a similar linear vector of values---*/

  /*---As previously, send functions vl[ia] = 1 + ia to functions
       vo[im] = 1 + im, subject to possible constant scalings
       and also to a power-of-two angle scalefactor adjustment
       designed to make the test more rigorous.
  ---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( i=0;      i<dims.nm;      ++i )
  {
    const int quot = ( i + 1 ) / dims.na;
    const int rem  = ( i + 1 ) % dims.na;

    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, i, dims.na-1, octant )
                                                                       += quot;
    if( rem != 0 )
    {
      *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, i, 0  , octant )
                                                                   += -P_one();
      *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, i, rem, octant )
                                                                   +=  P_one();
    }
  }

  /*---Fill matrix with entries that leave linears unaffected---*/

  /*---As before, create more complicated matrix by adding to rows
       entries that do not affect the scaled-affine input values expected.
  ---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm;     ++im )
  for( ia=0;     ia<dims.na-2;   ++ia )
  {
    const int randvalue = 37 + ( im + dims.nm * ia ) % 19;

    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia+0, octant ) +=
                                                          -P_one() * randvalue;
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia+1, octant ) +=
                                                         2*P_one() * randvalue;
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia+2, octant ) +=
                                                          -P_one() * randvalue;
  }

  /*---Scale matrix to compensate for 8 octants and also angle scale factor---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm;     ++im )
  for( ia=0;     ia<dims.na;     ++ia )
  {
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia, octant )
                                                                    /= NOCTANT;
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia, octant )
                                 /= Quantities_scalefactor_angle_( dims, ia );
  }

  Pointer_update_d( & quan->a_from_m );
  Pointer_update_d( & quan->m_from_a );

}